

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

fnet_socket_t fnet_socket_connect(fnet_address_t *addr)

{
  fnet_socket_t __fd;
  int iVar1;
  fnet_socket_t fVar2;
  fnet_socket_t fVar3;
  
  fVar2 = 0xffffffff;
  fVar3 = fVar2;
  if (((addr != (fnet_address_t *)0x0) &&
      (__fd = socket((uint)addr->ss_family,0,0), __fd != 0xffffffff)) &&
     (iVar1 = connect(__fd,(sockaddr *)addr,0x80), fVar3 = __fd, iVar1 == -1)) {
    close(__fd);
    fVar3 = fVar2;
  }
  return fVar3;
}

Assistant:

fnet_socket_t fnet_socket_connect(fnet_address_t const *addr)
{
    if (!addr)
    {
        FLOG_ERR("Invalid address");
        return FNET_INVALID_SOCKET;
    }

    int sock = socket(addr->ss_family, FNET_SOCK_STREAM, 0);
    if (sock == -1)
    {
        FLOG_ERR("Unable to create new socket");
        return FNET_INVALID_SOCKET;
    }

    if (connect(sock, (const struct sockaddr*)addr, sizeof *addr) == -1)
    {
        FLOG_ERR("Unable to establish new connection");
        close(sock);
        return FNET_INVALID_SOCKET;
    }

    return (fnet_socket_t)sock;
}